

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.cpp
# Opt level: O2

bool miniros::service::exists(string *service_name,bool print_failure_reason)

{
  bool bVar1;
  int iVar2;
  ServiceManagerPtr *pSVar3;
  mapped_type *pmVar4;
  socklen_t __len;
  uint32_t size;
  uint32_t port;
  shared_ptr<unsigned_char[]> buffer;
  TransportTCPPtr transport;
  M_string m;
  string mapped_name;
  string host;
  uint32_t *serv_port;
  
  names::resolve(&mapped_name,service_name,true);
  host._M_dataplus._M_p = (pointer)&host.field_2;
  host._M_string_length = 0;
  host.field_2._M_local_buf[0] = '\0';
  pSVar3 = ServiceManager::instance();
  serv_port = &port;
  bVar1 = ServiceManager::lookupService
                    ((pSVar3->
                     super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     ,&mapped_name,&host,serv_port);
  __len = (socklen_t)serv_port;
  if (bVar1) {
    m._M_t._M_impl._0_8_ = 0;
    buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                  _4_4_,1);
    std::make_shared<miniros::TransportTCP,miniros::PollSet*,miniros::TransportTCP::Flags>
              ((PollSet **)&transport,(Flags *)&m);
    iVar2 = TransportTCP::connect
                      (transport.
                       super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (int)&host,(sockaddr *)(ulong)port,__len);
    if ((char)iVar2 == '\0') {
      if (print_failure_reason) {
        if (console::g_initialized == '\0') {
          console::initialize();
        }
        if (exists::loc.initialized_ == false) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&m,"miniros.unknown_package",(allocator<char> *)&buffer);
          console::initializeLogLocation(&exists::loc,(string *)&m,Info);
          std::__cxx11::string::~string((string *)&m);
        }
        if (exists::loc.level_ != Info) {
          console::setLogLocationLevel(&exists::loc,Info);
          console::checkLogLocationEnabled(&exists::loc);
        }
        if (exists::loc.logger_enabled_ == true) {
          console::print((FilterBase *)0x0,exists::loc.logger_,exists::loc.level_,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                         ,0x48,"bool miniros::service::exists(const std::string &, bool)",
                         "waitForService: Service [%s] could not connect to host [%s:%d], waiting..."
                         ,mapped_name._M_dataplus._M_p,host._M_dataplus._M_p,(ulong)port);
        }
      }
    }
    else {
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &m._M_t._M_impl.super__Rb_tree_header._M_header;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"probe",(allocator<char> *)&size);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"md5sum",(allocator<char> *)&size);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::assign((char *)pmVar4);
      std::__cxx11::string::~string((string *)&buffer);
      this_node::getName_abi_cxx11_();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"callerid",(allocator<char> *)&size);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      std::__cxx11::string::~string((string *)&buffer);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&buffer,"service",(allocator<char> *)&size);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&m,(key_type *)&buffer);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      std::__cxx11::string::~string((string *)&buffer);
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      size = 0;
      Header::write((int)&m,&buffer,(size_t)&size);
      (*((transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Transport)._vptr_Transport[3])
                (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&size,4);
      (*((transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Transport)._vptr_Transport[3])
                (transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(ulong)size);
      (*((transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_Transport)._vptr_Transport[8])();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&buffer.super___shared_ptr<unsigned_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&m._M_t);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&transport.super___shared_ptr<miniros::TransportTCP,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar1 = true;
    if ((char)iVar2 != '\0') goto LAB_00243036;
  }
  else if (print_failure_reason) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&m,"miniros.unknown_package",(allocator<char> *)&buffer);
      console::initializeLogLocation
                (&exists(std::__cxx11::string_const&,bool)::loc,(string *)&m,Info);
      std::__cxx11::string::~string((string *)&m);
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.level_ != Info) {
      console::setLogLocationLevel(&exists(std::__cxx11::string_const&,bool)::loc,Info);
      console::checkLogLocationEnabled(&exists(std::__cxx11::string_const&,bool)::loc);
    }
    if (exists(std::__cxx11::string_const&,bool)::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,exists(std::__cxx11::string_const&,bool)::loc.logger_,
                     exists(std::__cxx11::string_const&,bool)::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/service.cpp"
                     ,0x50,"bool miniros::service::exists(const std::string &, bool)",
                     "waitForService: Service [%s] has not been advertised, waiting...",
                     mapped_name._M_dataplus._M_p);
    }
  }
  bVar1 = false;
LAB_00243036:
  std::__cxx11::string::~string((string *)&host);
  std::__cxx11::string::~string((string *)&mapped_name);
  return bVar1;
}

Assistant:

bool service::exists(const std::string& service_name, bool print_failure_reason)
{
  std::string mapped_name = names::resolve(service_name);

  std::string host;
  uint32_t port;

  if (ServiceManager::instance()->lookupService(mapped_name, host, port))
  {
    TransportTCPPtr transport(std::make_shared<TransportTCP>(static_cast<miniros::PollSet*>(NULL), TransportTCP::SYNCHRONOUS));

    if (transport->connect(host, port))
    {
      M_string m;
      m["probe"] = "1";
      m["md5sum"] = "*";
      m["callerid"] = this_node::getName();
      m["service"] = mapped_name;
      std::shared_ptr<uint8_t[]> buffer;
      uint32_t size = 0;;
      Header::write(m, buffer, size);
      transport->write((uint8_t*)&size, sizeof(size));
      transport->write(buffer.get(), size);
      transport->close();

      return true;
    }
    else
    {
      if (print_failure_reason)
      {
        MINIROS_INFO("waitForService: Service [%s] could not connect to host [%s:%d], waiting...", mapped_name.c_str(), host.c_str(), port);
      }
    }
  }
  else
  {
    if (print_failure_reason)
    {
      MINIROS_INFO("waitForService: Service [%s] has not been advertised, waiting...", mapped_name.c_str());
    }
  }

  return false;
}